

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O1

double pgamma(double x,double a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double in_XMM4_Qa;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_78;
  double local_28;
  
  if (a < 0.0) {
    printf("a must be non-negative");
    exit(1);
  }
  if (2e+20 < a) {
    dVar1 = 2e+20 / a;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    in_XMM4_Qa = 0.0;
    x = (x - (a + -0.3333333333333333)) * dVar1 + 2e+20;
    a = 2e+20;
    if (x < 0.0) {
      x = 0.0;
    }
  }
  if ((((a != 0.0) || (NAN(a))) && ((x != 0.0 || (NAN(x))))) && (x < a + 1.0)) {
    dVar1 = eps(1.0);
    dVar4 = 1.0;
    if (dVar1 * 100.0 <= 1.0) {
      dVar4 = 1.0;
      dVar5 = 1.0;
      dVar1 = a;
      do {
        dVar1 = dVar1 + 1.0;
        dVar5 = (dVar5 * x) / dVar1;
        dVar4 = dVar4 + dVar5;
        dVar7 = -dVar5;
        if (-dVar5 <= dVar5) {
          dVar7 = dVar5;
        }
        dVar2 = eps(dVar4);
      } while (dVar2 * 100.0 <= dVar7);
    }
    dVar1 = log(x);
    dVar5 = gamma_log(a + 1.0);
    dVar1 = exp((dVar1 * a - x) - dVar5);
    in_XMM4_Qa = 1.0;
    if (dVar1 * dVar4 <= 1.0 || x <= 0.0) {
      in_XMM4_Qa = dVar1 * dVar4;
    }
  }
  if (((a != 0.0) || (NAN(a))) && (a + 1.0 <= x)) {
    local_28 = 1.0 / x;
    local_78 = -local_28;
    dVar1 = local_78;
    if (local_78 <= local_28) {
      dVar1 = local_28;
    }
    dVar4 = eps(dVar1);
    if (dVar4 * 100.0 <= dVar1) {
      dVar5 = 0.0;
      dVar7 = 1.0;
      dVar2 = 1.0;
      dVar9 = 1.0;
      dVar1 = x;
      dVar4 = local_28;
      do {
        dVar2 = (dVar2 * (dVar9 - a) + dVar1) * local_28;
        dVar5 = ((dVar9 - a) * dVar5 + dVar7) * local_28;
        dVar1 = dVar1 * local_28 * dVar9 + x * dVar2;
        dVar7 = x * dVar5 + local_28 * dVar9 * dVar7;
        local_28 = 1.0 / dVar1;
        dVar9 = dVar9 + 1.0;
        dVar8 = dVar7 * local_28;
        dVar4 = dVar8 - dVar4;
        dVar6 = -dVar4;
        if (-dVar4 <= dVar4) {
          dVar6 = dVar4;
        }
        local_78 = -dVar8;
        dVar4 = local_78;
        if (local_78 <= dVar8) {
          dVar4 = dVar8;
        }
        dVar3 = eps(dVar4);
        dVar4 = dVar8;
      } while (dVar3 * 100.0 <= dVar6);
    }
    dVar1 = log(x);
    dVar4 = gamma_log(a);
    dVar1 = exp((dVar1 * a - x) - dVar4);
    in_XMM4_Qa = dVar1 * local_78 + 1.0;
  }
  return (double)(-(ulong)(a == 0.0) & 0x3ff0000000000000 |
                 ~-(ulong)(a == 0.0) & ~-(ulong)(x == 0.0) & (ulong)in_XMM4_Qa);
}

Assistant:

double pgamma(double x, double a) {
	double oup,ct,d,s,la;
	double a0,a1,b0,b1,g,g0,delta,fact;
	// Negative a
	if (a < 0.) {
		printf("a must be non-negative");
		exit(1);
	}
	
	// a -> inf
	la = 2.0e20;
	if (a > la) {
		x = la - 1.0/3.0 + sqrt(la/a)*(x - (a-1.0/3.0));
		a = la;
		if ( x < 0.0) {
			x = 0.0;
		}
	}
	
	// x < a + 1
	
	if ( a != 0 && x != 0 && x < a + 1) {
		ct = a;
		d = 1.;
		s = 1.;
		
		while (normf(d) >= 100*eps(s)) {
			ct += 1.0;
			d = x*d/ct;
			s += d;
		}
		oup = s * exp( -x + a * log(x) - gamma_log(a + 1));
		if ( x > 0 && oup > 1.) {
			oup = 1.0;
		}
	}
	
	if ( a != 0 && x >= a + 1) {
		a0 = 1.0;
		a1 = x;
		b0 = 0.0;
		b1 = 1.0;
		fact = 1.0/a1;
		ct = 1.0;
		g = b1 * fact;
		g0 = b0;
		delta = normf(g - g0);
		
		while (delta >= 100*eps(normf(g))) {
			g0 = g;
			d = ct - a;
			a0 = (a1 + a0*d)*fact;
			b0 = (b1 + b0*d)*fact;
			s = ct*fact;
			a1 = x * a0 + s * a1;
			b1 = x * b0 + s * b1;
			fact = 1.0/a1;
			ct += 1.0;
			g = b1 * fact;
			delta = normf(g - g0);
			
		}
		oup = 1.0 - g * exp( -x + a * log(x) - gamma_log(a));
		
	}
	
	if ( x == 0) {
		oup = 0.0;
	}
	
	if ( a == 0) {
		oup = 1.0;
	}
	
	
	return oup;
}